

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamRandomAccessController::LocateIndex
          (BamRandomAccessController *this,BamReaderPrivate *reader,IndexType *preferredType)

{
  ulong uVar1;
  BamReaderPrivate *in_stack_00000048;
  string *in_stack_00000050;
  BamRandomAccessController *in_stack_00000058;
  string message;
  string *indexFilename;
  BamReaderPrivate *in_stack_fffffffffffffec8;
  allocator local_101;
  string local_100 [32];
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  allocator local_b9;
  string local_b8 [24];
  undefined8 in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string local_68 [32];
  string local_48 [32];
  string *local_28;
  byte local_1;
  
  BamReaderPrivate::Filename_abi_cxx11_(in_stack_fffffffffffffec8);
  BamIndexFactory::FindIndexFilename
            (in_stack_ffffffffffffff68,(IndexType *)in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_68);
  local_28 = local_48;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_1 = OpenIndex(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"could not find index file for:",&local_b9);
    BamReaderPrivate::Filename_abi_cxx11_(in_stack_fffffffffffffec8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff20);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"BamRandomAccessController::LocateIndex",&local_101);
    SetErrorString((BamRandomAccessController *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    local_1 = 0;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  std::__cxx11::string::~string(local_48);
  return (bool)(local_1 & 1);
}

Assistant:

bool BamRandomAccessController::LocateIndex(BamReaderPrivate* reader,
                                            const BamIndex::IndexType& preferredType)
{
    // look up index filename, deferring to preferredType if possible
    assert(reader);
    const std::string& indexFilename =
        BamIndexFactory::FindIndexFilename(reader->Filename(), preferredType);

    // if no index file found (of any type)
    if (indexFilename.empty()) {
        const std::string message =
            std::string("could not find index file for:") + reader->Filename();
        SetErrorString("BamRandomAccessController::LocateIndex", message);
        return false;
    }

    // otherwise open & use index file that was found
    return OpenIndex(indexFilename, reader);
}